

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

int enet_socket_send(ENetSocket socket,ENetAddress *address,ENetBuffer *buffers,size_t bufferCount)

{
  undefined8 uVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  msghdr msgHdr;
  sockaddr_in6 sin;
  msghdr local_68;
  undefined8 local_28;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 uStack_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  
  local_68.msg_name = (undefined8 *)0x0;
  local_68.msg_namelen = 0;
  local_68._12_4_ = 0;
  local_68.msg_control = (void *)0x0;
  local_68.msg_controllen = 0;
  local_68.msg_flags = 0;
  local_68._52_4_ = 0;
  if (address != (ENetAddress *)0x0) {
    local_68.msg_name = &local_28;
    uStack_10 = 0;
    local_28 = (ulong)CONCAT22(address->port << 8 | address->port >> 8,10);
    uVar1 = *(undefined8 *)((long)&address->field_0 + 8);
    uStack_20 = (undefined4)*(undefined8 *)&address->field_0;
    uStack_1c = (undefined4)((ulong)*(undefined8 *)&address->field_0 >> 0x20);
    uStack_18 = (undefined4)uVar1;
    uStack_14 = (undefined4)((ulong)uVar1 >> 0x20);
    local_68.msg_namelen = 0x1c;
    local_68._12_4_ = 0;
  }
  local_68.msg_iov = (iovec *)buffers;
  local_68.msg_iovlen = bufferCount;
  sVar3 = sendmsg(socket,&local_68,0x4000);
  iVar2 = (int)sVar3;
  if (iVar2 == -1) {
    piVar4 = __errno_location();
    iVar2 = -(uint)(*piVar4 != 0xb);
  }
  return iVar2;
}

Assistant:

int enet_socket_send(ENetSocket socket, const ENetAddress* address, const ENetBuffer* buffers, size_t bufferCount) {
	struct msghdr msgHdr;
	struct sockaddr_in6 sin;
	int sentLength;

	memset(&msgHdr, 0, sizeof(struct msghdr));

	if (address != NULL) {
		memset(&sin, 0, sizeof(struct sockaddr_in6));

		sin.sin6_family = AF_INET6;
		sin.sin6_port = ENET_HOST_TO_NET_16(address->port);
		sin.sin6_addr = address->ipv6;
		msgHdr.msg_name = &sin;
		msgHdr.msg_namelen = sizeof(struct sockaddr_in6);
	}

	msgHdr.msg_iov = (struct iovec*)buffers;
	msgHdr.msg_iovlen = bufferCount;
	sentLength = sendmsg(socket, &msgHdr, MSG_NOSIGNAL);

	if (sentLength == -1) {
		if (errno == EWOULDBLOCK)
			return 0;

		ENET_LOG_ERROR("An error occurred sending data to socket. sendMsg result is negative, returned code is %i.", errno);
		return -1;
	}

	return sentLength;
}